

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seose_compat.cpp
# Opt level: O0

string * seose_to_base62_abi_cxx11_(string *__return_storage_ptr__,uint16_t input)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ushort local_16;
  undefined1 local_13;
  uint16_t local_12;
  uint16_t x;
  string *psStack_10;
  uint16_t input_local;
  string *result;
  
  local_13 = 0;
  local_12 = input;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while (local_12 != 0) {
    local_16 = local_12 + ((short)(local_12 / 0x3e) * 2 - (short)(local_12 / 0x3e << 6));
    local_12 = (uint16_t)((ulong)local_12 * 0x4210843 >> 0x20);
    std::operator+(&local_38,seose_to_base62::dict[local_16],__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string seose_to_base62(std::uint16_t input)
{
	static char dict[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";

	std::string result;

	while (input > 0)
	{
		std::uint16_t x = input % 62;
		input /= 62;
		result = dict[x] + result;
	}

	return result;
}